

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

int __thiscall
cmCTestCoverageHandler::HandleDelphiCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  size_t sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ostream *poVar3;
  string coverageFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string BinDir;
  cmParseDelphiCoverage cov;
  Glob g;
  ostringstream cmCTestLog_msg;
  long *local_278;
  long local_268 [2];
  string local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_220;
  cmParseDelphiCoverage local_200;
  Glob local_1f0;
  undefined1 local_198 [376];
  
  cmParseDelphiCoverage::cmParseDelphiCoverage
            (&local_200,cont,(this->super_cmCTestGenericHandler).CTest);
  cmsys::Glob::Glob(&local_1f0);
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0.Recurse = true;
  cmCTest::GetBinaryDir_abi_cxx11_(&local_220,(this->super_cmCTestGenericHandler).CTest);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_220._M_dataplus._M_p,
             local_220._M_dataplus._M_p + local_220._M_string_length);
  std::__cxx11::string::append((char *)&local_258);
  cmsys::Glob::FindFiles(&local_1f0,&local_258,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_238,__x);
  if (local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_238.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198," Cannot find Delphi coverage files: ",0x24);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x367,(char *)local_278,(this->super_cmCTestGenericHandler).Quiet);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Found Delphi HTML Files, Performing Coverage",0x2c);
    std::ios::widen((char)(ostream *)local_198 + (char)*(_func_int **)(local_198._0_8_ + -0x18));
    std::ostream::put((char)local_198);
    std::ostream::flush();
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x361,(char *)local_278,(this->super_cmCTestGenericHandler).Quiet);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    cmParseDelphiCoverage::LoadCoverageData(&local_200,&local_238);
  }
  sVar2 = (cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  cmsys::Glob::~Glob(&local_1f0);
  return (int)sVar2;
}

Assistant:

int cmCTestCoverageHandler::HandleDelphiCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmParseDelphiCoverage cov = cmParseDelphiCoverage(*cont, this->CTest);
  cmsys::Glob g;
  std::vector<std::string> files;
  g.SetRecurse(true);

  std::string BinDir = this->CTest->GetBinaryDir();
  std::string coverageFile = BinDir + "/*(*.pas).html";

  g.FindFiles(coverageFile);
  files = g.GetFiles();
  if (!files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found Delphi HTML Files, Performing Coverage"
                         << std::endl,
                       this->Quiet);
    cov.LoadCoverageData(files);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find Delphi coverage files: " << coverageFile
                                                              << std::endl,
                       this->Quiet);
  }
  return static_cast<int>(cont->TotalCoverage.size());
}